

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page-queue.c
# Opt level: O2

void mi_page_queue_enqueue_from_ex
               (mi_page_queue_t *to,mi_page_queue_t *from,_Bool enqueue_at_end,mi_page_t *page)

{
  mi_heap_t *heap;
  mi_page_t *pmVar1;
  mi_page_s *pmVar2;
  mi_page_t *pmVar3;
  undefined7 in_register_00000011;
  
  pmVar3 = (mi_page_t *)CONCAT71(in_register_00000011,enqueue_at_end);
  heap = *(mi_heap_t **)(CONCAT71(in_register_00000011,enqueue_at_end) + 0x40);
  pmVar1 = *(mi_page_t **)(CONCAT71(in_register_00000011,enqueue_at_end) + 0x48);
  pmVar2 = *(mi_page_s **)(CONCAT71(in_register_00000011,enqueue_at_end) + 0x50);
  if (pmVar2 != (mi_page_s *)0x0) {
    pmVar2->next = pmVar1;
  }
  if (pmVar1 != (mi_page_t *)0x0) {
    pmVar1->prev = pmVar2;
  }
  if (from->last == pmVar3) {
    from->last = pmVar3->prev;
  }
  if (from->first == pmVar3) {
    from->first = pmVar1;
    mi_heap_queue_first_update(heap,from);
  }
  pmVar2 = to->last;
  pmVar3->prev = pmVar2;
  pmVar3->next = (mi_page_s *)0x0;
  if (pmVar2 == (mi_page_s *)0x0) {
    to->first = pmVar3;
    to->last = pmVar3;
    mi_heap_queue_first_update(heap,to);
  }
  else {
    pmVar2->next = pmVar3;
    to->last = pmVar3;
  }
  (pmVar3->flags).full_aligned = (pmVar3->flags).full_aligned & 0xfe | to->block_size == 0x10010;
  return;
}

Assistant:

static void mi_page_queue_enqueue_from_ex(mi_page_queue_t* to, mi_page_queue_t* from, bool enqueue_at_end, mi_page_t* page) {
  mi_assert_internal(page != NULL);
  mi_assert_expensive(mi_page_queue_contains(from, page));
  mi_assert_expensive(!mi_page_queue_contains(to, page));
  const size_t bsize = mi_page_block_size(page);
  MI_UNUSED(bsize);
  mi_assert_internal((bsize == to->block_size && bsize == from->block_size) ||
                     (bsize == to->block_size && mi_page_queue_is_full(from)) ||
                     (bsize == from->block_size && mi_page_queue_is_full(to)) ||
                     (mi_page_is_large_or_huge(page) && mi_page_queue_is_huge(to)) ||
                     (mi_page_is_large_or_huge(page) && mi_page_queue_is_full(to)));

  mi_heap_t* heap = mi_page_heap(page);

  // delete from `from`
  if (page->prev != NULL) page->prev->next = page->next;
  if (page->next != NULL) page->next->prev = page->prev;
  if (page == from->last)  from->last = page->prev;
  if (page == from->first) {
    from->first = page->next;
    // update first
    mi_assert_internal(mi_heap_contains_queue(heap, from));
    mi_heap_queue_first_update(heap, from);
  }

  // insert into `to`
  if (enqueue_at_end) {
    // enqueue at the end
    page->prev = to->last;
    page->next = NULL;
    if (to->last != NULL) {
      mi_assert_internal(heap == mi_page_heap(to->last));
      to->last->next = page;
      to->last = page;
    }
    else {
      to->first = page;
      to->last = page;
      mi_heap_queue_first_update(heap, to);
    }
  }
  else {
    if (to->first != NULL) {
      // enqueue at 2nd place
      mi_assert_internal(heap == mi_page_heap(to->first));
      mi_page_t* next = to->first->next;
      page->prev = to->first;
      page->next = next;
      to->first->next = page;
      if (next != NULL) {
        next->prev = page;
      }
      else {
        to->last = page;
      }
    }
    else {
      // enqueue at the head (singleton list)
      page->prev = NULL;
      page->next = NULL;
      to->first = page;
      to->last = page;
      mi_heap_queue_first_update(heap, to);
    }
  }

  mi_page_set_in_full(page, mi_page_queue_is_full(to));
}